

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O0

sc_string_old __thiscall sc_dt::sc_string_old::uppercase(sc_string_old *this)

{
  char cVar1;
  int iVar2;
  sc_string_old *in_RSI;
  sc_string_rep *in_RDI;
  char c;
  int i;
  int len;
  sc_string_old *temp;
  int iVar3;
  
  iVar2 = length((sc_string_old *)0x2f3679);
  sc_string_old((sc_string_old *)in_RDI,in_RSI);
  for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    cVar1 = *(char *)(*(long *)(*(long *)in_RDI + 8) + (long)iVar3);
    if (('`' < cVar1) && (cVar1 < '{')) {
      *(char *)(*(long *)(*(long *)in_RDI + 8) + (long)iVar3) = cVar1 + -0x20;
    }
  }
  return (sc_string_old)in_RDI;
}

Assistant:

sc_string_old
sc_string_old::uppercase()const
{
    int len = length();
    sc_string_old temp(*this);
    for(int i=0; i<len; i++)
    {
	char c = temp.rep->str[i];
	if(c>='a' && c<='z')
	    temp.rep->str[i] = static_cast<char>( c-32 );
    }
    return temp;
}